

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
on_start(tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t> *this,
        parser_info_t<cfgfile::string_trait_t> *info)

{
  string_t *this_00;
  element_type *peVar1;
  tag_t<cfgfile::string_trait_t> *p;
  undefined8 in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  shared_ptr<cfgfile::generator::cfg::tag_field_t> *in_stack_ffffffffffffffb8;
  bool *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  this_00 = tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  tag_t<cfgfile::string_trait_t>::is_mandatory(in_RDI);
  std::make_shared<cfgfile::generator::cfg::tag_field_t,std::__cxx11::string_const&,bool>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::shared_ptr<cfgfile::generator::cfg::tag_field_t>::operator=
            ((shared_ptr<cfgfile::generator::cfg::tag_field_t> *)this_00,in_stack_ffffffffffffffb8);
  std::shared_ptr<cfgfile::generator::cfg::tag_field_t>::~shared_ptr
            ((shared_ptr<cfgfile::generator::cfg::tag_field_t> *)0x125a93);
  peVar1 = std::
           __shared_ptr_access<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x125aa1);
  p = tag_t<cfgfile::string_trait_t>::parent(in_RDI);
  tag_t<cfgfile::string_trait_t>::set_parent((tag_t<cfgfile::string_trait_t> *)peVar1,p);
  peVar1 = std::
           __shared_ptr_access<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x125acb);
  (*(peVar1->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    _vptr_tag_t[4])(peVar1,in_RSI);
  return;
}

Assistant:

void on_start( const parser_info_t< Trait > & info ) override
	{
		m_current = std::make_shared< T > ( this->name(), this->is_mandatory() );
		m_current->set_parent( this->parent() );
		m_current->on_start( info );
	}